

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::MatchGroupInst::Exec
          (MatchGroupInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  uint64 *puVar1;
  Type TVar2;
  Type pRVar3;
  bool bVar4;
  Char CVar5;
  Char CVar6;
  uint uVar7;
  GroupInfo *pGVar8;
  Char **ppCVar9;
  uint uVar10;
  uint uVar11;
  anon_class_8_1_a81546ea local_80;
  anon_class_8_1_a81546ea getNextCodePoint;
  Char *input_local;
  uint local_68;
  CharCount local_64;
  uint acth;
  uint tblidx;
  uint uStack_54;
  anon_class_16_2_48e5e701 toCanonical;
  uint local_3c;
  uint local_38;
  codepoint_t inputCodePoint;
  codepoint_t groupCodePoint;
  
  getNextCodePoint.input = input;
  toCanonical.input = (Char **)inputOffset;
  pGVar8 = Matcher::GroupIdToGroupInfo(matcher,(this->super_GroupMixin).groupId);
  uVar11 = pGVar8->length;
  if (1 < uVar11 + 1) {
    uVar10 = *(uint *)toCanonical.input;
    if (inputLength - uVar10 < uVar11) {
      bVar4 = Matcher::Fail(matcher,input,(CharCount *)toCanonical.input,instPointer,contStack,
                            assertionStack,qcTicks);
      return bVar4;
    }
    local_38 = pGVar8->offset;
    uVar11 = uVar11 + local_38;
    TVar2 = ((matcher->program).ptr)->flags;
    ppCVar9 = toCanonical.input;
    if ((TVar2 & IgnoreCaseRegexFlag) == NoRegexFlags) {
      pRVar3 = matcher->stats;
      uVar7 = local_38;
      do {
        if (pRVar3 != (Type)0x0) {
          puVar1 = &pRVar3->numCompares;
          *puVar1 = *puVar1 + 1;
        }
        if (input[uVar7] != input[uVar10]) {
          *(uint *)toCanonical.input = uVar10 + 1;
          goto LAB_00d4d467;
        }
        uVar7 = uVar7 + 1;
        uVar10 = uVar10 + 1;
      } while (uVar7 < uVar11);
      *(uint *)toCanonical.input = uVar10;
    }
    else {
      if ((TVar2 & UnicodeRegexFlag) != NoRegexFlags) {
        local_80.input = input;
        local_64 = inputLength;
LAB_00d4d387:
        do {
          bVar4 = Exec::anon_class_8_1_a81546ea::operator()
                            (&local_80,&local_38,uVar11,&inputCodePoint);
          if (!bVar4) goto LAB_00d4d26e;
          Exec::anon_class_8_1_a81546ea::operator()
                    (&local_80,(CharCount *)ppCVar9,local_64,&local_3c);
          bVar4 = Js::NumberUtilities::IsInSupplementaryPlane(inputCodePoint);
          if (bVar4) {
            _acth = _acth & 0xffffffff00000000;
            local_68 = 0;
            CaseInsensitive::RangeToEquivClass
                      (&acth,inputCodePoint,inputCodePoint,&local_68,&tblidx);
            if (((local_3c == tblidx) || (local_3c == uStack_54)) ||
               (local_3c == (uint)toCanonical.matcher)) goto LAB_00d4d387;
            bVar4 = local_3c == toCanonical.matcher._4_4_;
          }
          else {
            _acth = matcher;
            CVar5 = Exec::anon_class_8_1_b578bc12::operator()
                              ((anon_class_8_1_b578bc12 *)&acth,inputCodePoint);
            CVar6 = Exec::anon_class_8_1_b578bc12::operator()
                              ((anon_class_8_1_b578bc12 *)&acth,local_3c);
            bVar4 = CVar5 == CVar6;
            ppCVar9 = toCanonical.input;
          }
        } while (bVar4);
LAB_00d4d467:
        bVar4 = Matcher::Fail(matcher,input,(CharCount *)ppCVar9,instPointer,contStack,
                              assertionStack,qcTicks);
        return bVar4;
      }
      do {
        if (matcher->stats != (Type)0x0) {
          puVar1 = &matcher->stats->numCompares;
          *puVar1 = *puVar1 + 1;
        }
        toCanonical.matcher = (Matcher *)&getNextCodePoint;
        _tblidx = (LoopInfo *)matcher;
        CVar5 = Exec::anon_class_16_2_48e5e701::operator()
                          ((anon_class_16_2_48e5e701 *)&tblidx,&local_38);
        CVar6 = Exec::anon_class_16_2_48e5e701::operator()
                          ((anon_class_16_2_48e5e701 *)&tblidx,(CharCount *)toCanonical.input);
        ppCVar9 = toCanonical.input;
        input = getNextCodePoint.input;
        if (CVar5 != CVar6) goto LAB_00d4d467;
      } while (local_38 < uVar11);
    }
  }
LAB_00d4d26e:
  *instPointer = *instPointer + 5;
  return false;
}

Assistant:

inline bool MatchGroupInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        GroupInfo* const info = matcher.GroupIdToGroupInfo(groupId);
        if (!info->IsUndefined() && info->length > 0)
        {
            if (info->length > inputLength - inputOffset)
            {
                return matcher.Fail(FAIL_PARAMETERS);
            }

            CharCount groupOffset = info->offset;
            const CharCount groupEndOffset = groupOffset + info->length;

            bool isCaseInsensitiveMatch = (matcher.program->flags & IgnoreCaseRegexFlag) != 0;
            bool isCodePointList = (matcher.program->flags & UnicodeRegexFlag) != 0;

            // This is the only place in the runtime machinery we need to convert characters to their equivalence class
            if (isCaseInsensitiveMatch && isCodePointList)
            {
                auto getNextCodePoint = [=](CharCount &offset, CharCount endOffset, codepoint_t &codePoint) {
                    if (endOffset <= offset)
                    {
                        return false;
                    }

                    Char lowerPart = input[offset];
                    if (!Js::NumberUtilities::IsSurrogateLowerPart(lowerPart) || offset + 1 == endOffset)
                    {
                        codePoint = lowerPart;
                        offset += 1;
                        return true;
                    }

                    Char upperPart = input[offset + 1];
                    if (!Js::NumberUtilities::IsSurrogateUpperPart(upperPart))
                    {
                        codePoint = lowerPart;
                        offset += 1;
                    }
                    else
                    {
                        codePoint = Js::NumberUtilities::SurrogatePairAsCodePoint(lowerPart, upperPart);
                        offset += 2;
                    }

                    return true;
                };

                codepoint_t equivs[CaseInsensitive::EquivClassSize];
                while (true)
                {
                    codepoint_t groupCodePoint;
                    bool hasGroupCodePoint = getNextCodePoint(groupOffset, groupEndOffset, groupCodePoint);
                    if (!hasGroupCodePoint)
                    {
                        break;
                    }

                    // We don't need to verify that there is a valid input code point since at the beginning
                    // of the function, we make sure that the length of the input is at least as long as the
                    // length of the group.
                    codepoint_t inputCodePoint;
                    getNextCodePoint(inputOffset, inputLength, inputCodePoint);

                    bool doesMatch = false;
                    if (!Js::NumberUtilities::IsInSupplementaryPlane(groupCodePoint))
                    {
                        auto toCanonical = [&](codepoint_t c) {
                            return matcher.standardChars->ToCanonical(
                                CaseInsensitive::MappingSource::CaseFolding,
                                static_cast<char16>(c));
                        };
                        doesMatch = (toCanonical(groupCodePoint) == toCanonical(inputCodePoint));
                    }
                    else
                    {
                        uint tblidx = 0;
                        uint acth = 0;
                        CaseInsensitive::RangeToEquivClass(tblidx, groupCodePoint, groupCodePoint, acth, equivs);
                        CompileAssert(CaseInsensitive::EquivClassSize == 4);
                        doesMatch =
                            inputCodePoint == equivs[0]
                            || inputCodePoint == equivs[1]
                            || inputCodePoint == equivs[2]
                            || inputCodePoint == equivs[3];
                    }

                    if (!doesMatch)
                    {
                        return matcher.Fail(FAIL_PARAMETERS);
                    }
                }
            }
            else if (isCaseInsensitiveMatch)
            {
                do
                {
#if ENABLE_REGEX_CONFIG_OPTIONS
                    matcher.CompStats();
#endif
                    auto toCanonical = [&](CharCount &offset) {
                        return matcher.standardChars->ToCanonical(CaseInsensitive::MappingSource::UnicodeData, input[offset++]);
                    };

                    if (toCanonical(groupOffset) != toCanonical(inputOffset))
                    {
                        return matcher.Fail(FAIL_PARAMETERS);
                    }
                }
                while (groupOffset < groupEndOffset);
            }
            else
            {
                do
                {
#if ENABLE_REGEX_CONFIG_OPTIONS
                    matcher.CompStats();
#endif
                    if (input[groupOffset++] != input[inputOffset++])
                    {
                        return matcher.Fail(FAIL_PARAMETERS);
                    }
                }
                while (groupOffset < groupEndOffset);
            }
        }
        // else: trivially match empty string

        instPointer += sizeof(*this);
        return false;
    }